

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **ppuVar1;
  size_t *outlen;
  libssh2_nonblocking_states lVar2;
  uchar *data;
  uint8_t *private_key;
  uchar *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  BIGNUM *pBVar12;
  size_t sVar13;
  uchar *puVar14;
  void **ppvVar15;
  LIBSSH2_CRYPT_METHOD *pLVar16;
  _LIBSSH2_MAC_METHOD *p_Var17;
  LIBSSH2_COMP_METHOD *pLVar18;
  char *pcVar19;
  ulong uVar20;
  void **ppvVar21;
  size_t sVar22;
  ulong uVar23;
  long lStackY_c0;
  EVP_MD_CTX *fingerprint_ctx;
  void **local_98;
  uchar *server_public_key;
  uint local_84;
  uchar *local_80;
  uchar *server_host_key;
  size_t server_public_key_len;
  uint local_64;
  uchar *s;
  uchar *local_58;
  ulong local_50;
  uchar **local_48;
  size_t *local_40;
  size_t hostkey_len;
  
  iVar7 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    break;
  default:
    goto switchD_00112910_caseD_1;
  case libssh2_NB_state_created:
    goto switchD_00112910_caseD_2;
  case libssh2_NB_state_sent:
    sVar22 = key_state->request_len;
    goto LAB_001129d5;
  case libssh2_NB_state_sent1:
    goto switchD_00112910_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00112910_caseD_5;
  }
  key_state->public_key_oct = (uchar *)0x0;
  key_state->state = libssh2_NB_state_created;
switchD_00112910_caseD_2:
  s = (uchar *)0x0;
  pcVar19 = session->kex->name;
  iVar7 = strcmp(pcVar19,"curve25519-sha256@libssh.org");
  if ((iVar7 == 0) || (iVar7 = strcmp(pcVar19,"curve25519-sha256"), iVar7 == 0)) {
    iVar7 = _libssh2_curve25519_new
                      (session,&key_state->curve25519_public_key,&key_state->curve25519_private_key)
    ;
    if (iVar7 != 0) {
      pcVar19 = "Unable to create private key";
      goto LAB_00112b0a;
    }
    key_state->request[0] = '\x1e';
    s = key_state->request + 1;
    _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
    key_state->request_len = 0x25;
    key_state->state = libssh2_NB_state_sent;
    sVar22 = 0x25;
LAB_001129d5:
    iVar7 = _libssh2_transport_send(session,key_state->request,sVar22,(uchar *)0x0,0);
    if (iVar7 == -0x25) {
      return -0x25;
    }
    if (iVar7 != 0) {
      pcVar19 = "Unable to send ECDH_INIT";
      goto LAB_00112b0a;
    }
    key_state->state = libssh2_NB_state_sent1;
switchD_00112910_caseD_4:
    iVar7 = _libssh2_packet_require
                      (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                       &key_state->req_state);
    if (iVar7 == -0x25) {
      return -0x25;
    }
    if (iVar7 != 0) {
      pcVar19 = "Timeout waiting for ECDH_REPLY reply";
      goto LAB_00112b0a;
    }
    key_state->state = libssh2_NB_state_sent2;
switchD_00112910_caseD_5:
    uVar23 = key_state->data_len;
    if (4 < uVar23) {
      lVar2 = (key_state->exchange_state).state;
      iVar7 = 0;
      if (libssh2_NB_state_sent2 < lVar2) goto switchD_00112aa0_caseD_1;
      puVar14 = key_state->data;
      data = key_state->curve25519_public_key;
      private_key = key_state->curve25519_private_key;
      switch(lVar2) {
      case libssh2_NB_state_idle:
        pBVar12 = BN_new();
        (key_state->exchange_state).k = (BIGNUM *)pBVar12;
        (key_state->exchange_state).state = libssh2_NB_state_created;
        break;
      default:
        goto switchD_00112aa0_caseD_1;
      case libssh2_NB_state_created:
        break;
      case libssh2_NB_state_sent:
        goto switchD_00112aa0_caseD_3;
      case libssh2_NB_state_sent2:
        goto switchD_00112aa0_caseD_5;
      }
      local_58 = puVar14 + 1;
      s = puVar14;
      local_50 = uVar23;
      iVar7 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
      if (iVar7 != 0) {
        pcVar19 = "Unexpected curve25519 key length 2";
LAB_00112aee:
        iVar7 = -0xe;
        goto LAB_0011327d;
      }
      session->server_hostkey_len = (uint32_t)hostkey_len;
      puVar14 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
      session->server_hostkey = puVar14;
      if (puVar14 == (uchar *)0x0) {
        pcVar19 = "Unable to allocate memory for a copy of the host curve25519 key";
LAB_00112c74:
        iVar7 = -6;
        goto LAB_0011327d;
      }
      memcpy(puVar14,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
             (ulong)session->server_hostkey_len);
      iVar7 = _libssh2_md5_init(&fingerprint_ctx);
      if (((iVar7 == 0) ||
          (iVar7 = _libssh2_md5_update(&fingerprint_ctx,session->server_hostkey,
                                       (ulong)session->server_hostkey_len), iVar7 == 0)) ||
         (iVar7 = _libssh2_md5_final(&fingerprint_ctx,session->server_hostkey_md5), iVar7 == 0)) {
        iVar7 = 0;
      }
      else {
        iVar7 = 1;
      }
      session->server_hostkey_md5_valid = iVar7;
      iVar7 = _libssh2_sha1_init(&fingerprint_ctx);
      if (((iVar7 == 0) ||
          (iVar7 = _libssh2_sha1_update
                             (&fingerprint_ctx,session->server_hostkey,
                              (ulong)session->server_hostkey_len), iVar7 == 0)) ||
         (iVar7 = _libssh2_sha1_final(&fingerprint_ctx,session->server_hostkey_sha1), iVar7 == 0)) {
        iVar7 = 0;
      }
      else {
        iVar7 = 1;
      }
      session->server_hostkey_sha1_valid = iVar7;
      iVar7 = _libssh2_sha256_init(&fingerprint_ctx);
      if (((iVar7 == 0) ||
          (iVar7 = _libssh2_sha256_update
                             (&fingerprint_ctx,session->server_hostkey,
                              (ulong)session->server_hostkey_len), iVar7 == 0)) ||
         (iVar7 = _libssh2_sha256_final(&fingerprint_ctx,session->server_hostkey_sha256), iVar7 == 0
         )) {
        iVar7 = 0;
      }
      else {
        iVar7 = 1;
      }
      session->server_hostkey_sha256_valid = iVar7;
      iVar7 = (*session->hostkey->init)
                        (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                         &session->server_hostkey_abstract);
      if (iVar7 != 0) {
        pcVar19 = "Unable to initialize hostkey importer curve25519";
        goto LAB_00112c69;
      }
      iVar7 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
      if (iVar7 != 0) {
        pcVar19 = "Unexpected curve25519 key length";
        goto LAB_00112aee;
      }
      if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) == 0x20) {
        ppuVar1 = &(key_state->exchange_state).h_sig;
        outlen = &(key_state->exchange_state).h_sig_len;
        local_98 = &session->server_hostkey_abstract;
        iVar7 = _libssh2_get_string((string_buf *)&s,ppuVar1,outlen);
        if (iVar7 != 0) {
          pcVar19 = "Unexpected curve25519 server sig length";
          goto LAB_00112c69;
        }
        local_40 = outlen;
        iVar7 = _libssh2_curve25519_gen_k
                          (&(key_state->exchange_state).k,private_key,
                           (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
        if (iVar7 != 0) {
          pcVar19 = "Unable to create curve25519 shared secret";
          iVar7 = -5;
          goto LAB_0011327d;
        }
        local_48 = ppuVar1;
        iVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        (key_state->exchange_state).k_value_len = (long)((iVar7 + 7) / 8 + 5);
        uVar8 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        sVar22 = (key_state->exchange_state).k_value_len;
        if ((uVar8 & 7) != 0) {
          sVar22 = sVar22 - 1;
          (key_state->exchange_state).k_value_len = sVar22;
        }
        puVar14 = (uchar *)(*session->alloc)(sVar22,&session->abstract);
        (key_state->exchange_state).k_value = puVar14;
        if (puVar14 == (uchar *)0x0) {
          pcVar19 = "Unable to allocate buffer for K";
          goto LAB_00112c74;
        }
        _libssh2_htonu32(puVar14,(int)(key_state->exchange_state).k_value_len - 4);
        uVar8 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        if ((uVar8 & 7) == 0) {
          (key_state->exchange_state).k_value[4] = '\0';
          lStackY_c0 = 5;
        }
        else {
          lStackY_c0 = 4;
        }
        BN_bn2bin((BIGNUM *)(key_state->exchange_state).k,
                  (key_state->exchange_state).k_value + lStackY_c0);
        iVar7 = _libssh2_sha256_init(&fingerprint_ctx);
        if (iVar7 == 0) {
LAB_00113079:
          pcVar19 = "Unable to verify hostkey signature curve25519";
          iVar7 = -0xb;
          goto LAB_0011327d;
        }
        (key_state->exchange_state).exchange_hash = &fingerprint_ctx;
        puVar3 = (session->local).banner;
        puVar14 = (key_state->exchange_state).h_sig_comp;
        local_80 = puVar14;
        if (puVar3 == (uchar *)0x0) {
          _libssh2_htonu32(puVar14,0x1a);
          uVar8 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,4);
          pcVar19 = "SSH-2.0-libssh2_1.11.1_DEV";
          sVar22 = 0x1a;
        }
        else {
          sVar13 = strlen((char *)puVar3);
          puVar14 = local_80;
          _libssh2_htonu32(local_80,(int)sVar13 - 2);
          uVar8 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,4);
          pcVar19 = (char *)(session->local).banner;
          sVar13 = strlen(pcVar19);
          sVar22 = sVar13 - 2;
        }
        uVar9 = _libssh2_sha256_update(&fingerprint_ctx,pcVar19,sVar22);
        local_84 = uVar9 & uVar8 & 1;
        sVar13 = strlen((char *)(session->remote).banner);
        puVar3 = local_80;
        _libssh2_htonu32(local_80,(uint32_t)sVar13);
        uVar8 = _libssh2_sha256_update(&fingerprint_ctx,puVar3,4);
        puVar14 = (session->remote).banner;
        sVar13 = strlen((char *)puVar14);
        uVar9 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,sVar13);
        _libssh2_htonu32(puVar3,(uint32_t)(session->local).kexinit_len);
        uVar10 = _libssh2_sha256_update(&fingerprint_ctx,puVar3,4);
        uVar11 = _libssh2_sha256_update
                           (&fingerprint_ctx,(session->local).kexinit,(session->local).kexinit_len);
        local_84 = uVar11 & uVar10 & uVar9 & uVar8 & local_84;
        _libssh2_htonu32(puVar3,(uint32_t)(session->remote).kexinit_len);
        uVar8 = _libssh2_sha256_update(&fingerprint_ctx,puVar3,4);
        uVar9 = _libssh2_sha256_update
                          (&fingerprint_ctx,(session->remote).kexinit,(session->remote).kexinit_len)
        ;
        puVar14 = local_80;
        _libssh2_htonu32(local_80,session->server_hostkey_len);
        uVar10 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,4);
        local_64 = _libssh2_sha256_update
                             (&fingerprint_ctx,session->server_hostkey,
                              (ulong)session->server_hostkey_len);
        puVar14 = local_80;
        local_64 = local_64 & uVar10 & uVar9 & uVar8;
        _libssh2_htonu32(local_80,0x20);
        uVar8 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,4);
        uVar8 = uVar8 & local_64;
        uVar9 = _libssh2_sha256_update(&fingerprint_ctx,data,0x20);
        uVar11 = uVar9 & uVar8 & local_84;
        _libssh2_htonu32(puVar14,(uint32_t)server_public_key_len);
        uVar8 = _libssh2_sha256_update(&fingerprint_ctx,puVar14,4);
        uVar9 = _libssh2_sha256_update
                          (&fingerprint_ctx,
                           (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                           CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
        uVar10 = _libssh2_sha256_update
                           (&fingerprint_ctx,(key_state->exchange_state).k_value,
                            (key_state->exchange_state).k_value_len);
        if ((((uVar9 & uVar8 & uVar11 & uVar10) == 0) ||
            (iVar7 = _libssh2_sha256_final(&fingerprint_ctx,local_80), iVar7 == 0)) ||
           (iVar7 = (*session->hostkey->sig_verify)
                              (session,*local_48,*local_40,local_80,0x20,local_98), iVar7 != 0))
        goto LAB_00113079;
        (key_state->exchange_state).c = '\x15';
        (key_state->exchange_state).state = libssh2_NB_state_sent;
switchD_00112aa0_caseD_3:
        iVar7 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
        if (iVar7 == -0x25) {
          return -0x25;
        }
        if (iVar7 != 0) {
          pcVar19 = "Unable to send NEWKEYS message curve25519";
          goto LAB_0011327d;
        }
        (key_state->exchange_state).state = libssh2_NB_state_sent2;
switchD_00112aa0_caseD_5:
        ppuVar1 = &(key_state->exchange_state).tmp;
        iVar7 = _libssh2_packet_require
                          (session,'\x15',ppuVar1,&(key_state->exchange_state).tmp_len,0,
                           (uchar *)0x0,0,&(key_state->exchange_state).req_state);
        if (iVar7 == -0x25) {
          return -0x25;
        }
        if (iVar7 != 0) {
          pcVar19 = "Timed out waiting for NEWKEYS curve25519";
          goto LAB_0011327d;
        }
        *(byte *)&session->state = (byte)session->state | 4;
        (*session->free)(*ppuVar1,&session->abstract);
        if (session->session_id == (uchar *)0x0) {
          puVar14 = (uchar *)(*session->alloc)(0x20,&session->abstract);
          session->session_id = puVar14;
          if (puVar14 == (uchar *)0x0) {
            pcVar19 = "Unable to allocate buffer for SHA digest";
            goto LAB_00112c74;
          }
          uVar4 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
          uVar5 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
          uVar6 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
          *(undefined8 *)(puVar14 + 0x10) =
               *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
          *(undefined8 *)(puVar14 + 0x18) = uVar6;
          *(undefined8 *)puVar14 = uVar4;
          *(undefined8 *)(puVar14 + 8) = uVar5;
          session->session_id_len = 0x20;
        }
        pLVar16 = (session->local).crypt;
        if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*pLVar16->dtor)(session,&(session->local).crypt_abstract);
          pLVar16 = (session->local).crypt;
        }
        if (pLVar16->init !=
            (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
             *)0x0) {
          server_public_key._0_4_ = 0;
          server_host_key._0_4_ = 0;
          ppvVar15 = (void **)(*session->alloc)((long)pLVar16->iv_len + 0x20,&session->abstract);
          if (ppvVar15 != (void **)0x0) {
            puVar14 = (key_state->exchange_state).h_sig_comp;
            uVar23 = 0;
            do {
              pLVar16 = (session->local).crypt;
              if ((ulong)(long)pLVar16->iv_len <= uVar23) {
                local_98 = (void **)(*session->alloc)((long)pLVar16->secret_len + 0x20,
                                                      &session->abstract);
                if (local_98 == (void **)0x0) goto LAB_001136a3;
                uVar23 = 0;
                goto LAB_0011336a;
              }
              iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
              if (((iVar7 == 0) ||
                  (iVar7 = _libssh2_sha256_update
                                     ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                      (key_state->exchange_state).k_value_len), iVar7 == 0)) ||
                 (iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar14,0x20), iVar7 == 0))
              break;
              uVar20 = uVar23;
              ppvVar21 = ppvVar15;
              if (uVar23 == 0) {
                iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"A",1);
                if (iVar7 == 0) break;
                uVar20 = (ulong)session->session_id_len;
                ppvVar21 = (void **)session->session_id;
              }
              iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar21,uVar20);
              if (iVar7 == 0) break;
              iVar7 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)ppvVar15 + uVar23));
              uVar23 = uVar23 + 0x20;
            } while (iVar7 != 0);
            (*session->free)(ppvVar15,&session->abstract);
          }
          iVar7 = -1;
          goto switchD_00112aa0_caseD_1;
        }
LAB_001134ab:
        pLVar16 = (session->remote).crypt;
        if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*pLVar16->dtor)(session,&(session->remote).crypt_abstract);
          pLVar16 = (session->remote).crypt;
        }
        if (pLVar16->init !=
            (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
             *)0x0) {
          server_public_key._0_4_ = 0;
          server_host_key._0_4_ = 0;
          ppvVar15 = (void **)(*session->alloc)((long)pLVar16->iv_len + 0x20,&session->abstract);
          if (ppvVar15 == (void **)0x0) goto LAB_001136aa;
          puVar14 = (key_state->exchange_state).h_sig_comp;
          uVar23 = 0;
          while (pLVar16 = (session->remote).crypt, uVar23 < (ulong)(long)pLVar16->iv_len) {
            iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar7 == 0) ||
                (iVar7 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar7 == 0)) ||
               (iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar14,0x20), iVar7 == 0))
            goto LAB_001136a3;
            uVar20 = uVar23;
            ppvVar21 = ppvVar15;
            if (uVar23 == 0) {
              iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"B",1);
              if (iVar7 == 0) goto LAB_001136a3;
              uVar20 = (ulong)session->session_id_len;
              ppvVar21 = (void **)session->session_id;
            }
            iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar21,uVar20);
            if (iVar7 == 0) goto LAB_001136a3;
            iVar7 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)ppvVar15 + uVar23));
            uVar23 = uVar23 + 0x20;
            if (iVar7 == 0) goto LAB_001136a3;
          }
          local_98 = (void **)(*session->alloc)((long)pLVar16->secret_len + 0x20,&session->abstract)
          ;
          if (local_98 != (void **)0x0) {
            uVar23 = 0;
            goto LAB_001135e8;
          }
          goto LAB_001136a3;
        }
LAB_0011373c:
        p_Var17 = (session->local).mac;
        if (p_Var17->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
          (*p_Var17->dtor)(session,&(session->local).mac_abstract);
          p_Var17 = (session->local).mac;
        }
        if (p_Var17->init == (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
LAB_0011388c:
          p_Var17 = (session->remote).mac;
          if (p_Var17->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var17->dtor)(session,&(session->remote).mac_abstract);
            p_Var17 = (session->remote).mac;
          }
          if (p_Var17->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0)
          {
            server_public_key._0_4_ = 0;
            ppvVar15 = (void **)(*session->alloc)((long)p_Var17->key_len + 0x20,&session->abstract);
            if (ppvVar15 != (void **)0x0) {
              uVar23 = 0;
              do {
                p_Var17 = (session->remote).mac;
                if ((ulong)(long)p_Var17->key_len <= uVar23) {
                  (*p_Var17->init)(session,(uchar *)ppvVar15,(int *)&server_public_key,
                                   &(session->remote).mac_abstract);
                  if ((int)server_public_key != 0) {
                    explicit_bzero(ppvVar15,(long)((session->remote).mac)->key_len);
                    (*session->free)(ppvVar15,&session->abstract);
                  }
                  goto LAB_001139dc;
                }
                iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar7 == 0) ||
                    (iVar7 = _libssh2_sha256_update
                                       ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                        (key_state->exchange_state).k_value_len), iVar7 == 0)) ||
                   (iVar7 = _libssh2_sha256_update
                                      ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20
                                      ), iVar7 == 0)) break;
                uVar20 = uVar23;
                ppvVar21 = ppvVar15;
                if (uVar23 == 0) {
                  iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"F",1);
                  if (iVar7 == 0) break;
                  uVar20 = (ulong)session->session_id_len;
                  ppvVar21 = (void **)session->session_id;
                }
                iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar21,uVar20);
                if (iVar7 == 0) break;
                iVar7 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)ppvVar15 + uVar23));
                uVar23 = uVar23 + 0x20;
              } while (iVar7 != 0);
              goto LAB_001136a3;
            }
            goto LAB_001136aa;
          }
LAB_001139dc:
          pLVar18 = (session->local).comp;
          if (pLVar18 != (LIBSSH2_COMP_METHOD *)0x0) {
            if (pLVar18->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
              (*pLVar18->dtor)(session,1,&(session->local).comp_abstract);
              pLVar18 = (session->local).comp;
              if (pLVar18 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_00113a2c;
            }
            if ((pLVar18->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) &&
               (iVar7 = (*pLVar18->init)(session,1,&(session->local).comp_abstract), iVar7 != 0))
            goto LAB_001136aa;
          }
LAB_00113a2c:
          pLVar18 = (session->remote).comp;
          iVar7 = 0;
          if (pLVar18 != (LIBSSH2_COMP_METHOD *)0x0) {
            if (pLVar18->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
              iVar7 = 0;
              (*pLVar18->dtor)(session,0,&(session->remote).comp_abstract);
              pLVar18 = (session->remote).comp;
              if (pLVar18 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_00112aa0_caseD_1;
            }
            iVar7 = 0;
            if (pLVar18->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
              iVar7 = (*pLVar18->init)(session,0,&(session->remote).comp_abstract);
              iVar7 = (uint)(iVar7 == 0) * 5 + -5;
            }
          }
          goto switchD_00112aa0_caseD_1;
        }
        server_public_key._0_4_ = 0;
        ppvVar15 = (void **)(*session->alloc)((long)p_Var17->key_len + 0x20,&session->abstract);
        if (ppvVar15 != (void **)0x0) {
          uVar23 = 0;
          do {
            p_Var17 = (session->local).mac;
            if ((ulong)(long)p_Var17->key_len <= uVar23) {
              (*p_Var17->init)(session,(uchar *)ppvVar15,(int *)&server_public_key,
                               &(session->local).mac_abstract);
              if ((int)server_public_key != 0) {
                explicit_bzero(ppvVar15,(long)((session->local).mac)->key_len);
                (*session->free)(ppvVar15,&session->abstract);
              }
              goto LAB_0011388c;
            }
            iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar7 == 0) ||
                (iVar7 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar7 == 0)) ||
               (iVar7 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar7 == 0)) break;
            uVar20 = uVar23;
            ppvVar21 = ppvVar15;
            if (uVar23 == 0) {
              iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"E",1);
              if (iVar7 == 0) break;
              uVar20 = (ulong)session->session_id_len;
              ppvVar21 = (void **)session->session_id;
            }
            iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar21,uVar20);
            if (iVar7 == 0) break;
            iVar7 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)ppvVar15 + uVar23));
            uVar23 = uVar23 + 0x20;
          } while (iVar7 != 0);
          goto LAB_001136a3;
        }
        goto LAB_001136aa;
      }
      pcVar19 = "Unexpected curve25519 server public key length";
LAB_00112c69:
      iVar7 = -10;
LAB_0011327d:
      iVar7 = _libssh2_error(session,iVar7,pcVar19);
      goto switchD_00112aa0_caseD_1;
    }
    iVar7 = _libssh2_error(session,-10,"Data is too short");
    goto LAB_001132b7;
  }
  pcVar19 = "Unknown KEX curve25519 curve type";
  iVar7 = -1;
LAB_00112b0a:
  iVar7 = _libssh2_error(session,iVar7,pcVar19);
  goto switchD_00112910_caseD_1;
  while( true ) {
    uVar20 = uVar23;
    ppvVar21 = local_98;
    if (uVar23 == 0) {
      iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"C",1);
      if (iVar7 == 0) break;
      uVar20 = (ulong)session->session_id_len;
      ppvVar21 = (void **)session->session_id;
    }
    iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar21,uVar20);
    if (iVar7 == 0) break;
    iVar7 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)local_98 + uVar23));
    uVar23 = uVar23 + 0x20;
    if (iVar7 == 0) break;
LAB_0011336a:
    pLVar16 = (session->local).crypt;
    if ((ulong)(long)pLVar16->secret_len <= uVar23) {
      iVar7 = (*pLVar16->init)(session,pLVar16,(uchar *)ppvVar15,(int *)&server_public_key,
                               (uchar *)local_98,(int *)&server_host_key,1,
                               &(session->local).crypt_abstract);
      if (iVar7 != 0) goto LAB_001136de;
      if ((int)server_public_key != 0) {
        explicit_bzero(ppvVar15,(long)((session->local).crypt)->iv_len);
        (*session->free)(ppvVar15,&session->abstract);
      }
      ppvVar15 = local_98;
      if ((int)server_host_key != 0) {
        explicit_bzero(local_98,(long)((session->local).crypt)->secret_len);
        (*session->free)(ppvVar15,&session->abstract);
      }
      goto LAB_001134ab;
    }
    iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
    if (((iVar7 == 0) ||
        (iVar7 = _libssh2_sha256_update
                           ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                            (key_state->exchange_state).k_value_len), iVar7 == 0)) ||
       (iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar14,0x20), iVar7 == 0)) break;
  }
  goto LAB_00113694;
LAB_001136de:
  (*session->free)(ppvVar15,&session->abstract);
  ppvVar15 = local_98;
  goto LAB_001136a3;
  while( true ) {
    uVar20 = uVar23;
    ppvVar21 = local_98;
    if (uVar23 == 0) {
      iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"D",1);
      if (iVar7 == 0) break;
      uVar20 = (ulong)session->session_id_len;
      ppvVar21 = (void **)session->session_id;
    }
    iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,ppvVar21,uVar20);
    if (iVar7 == 0) break;
    iVar7 = _libssh2_sha256_final((EVP_MD_CTX **)&s,(uchar *)((long)local_98 + uVar23));
    uVar23 = uVar23 + 0x20;
    if (iVar7 == 0) break;
LAB_001135e8:
    pLVar16 = (session->remote).crypt;
    if ((ulong)(long)pLVar16->secret_len <= uVar23) {
      iVar7 = (*pLVar16->init)(session,pLVar16,(uchar *)ppvVar15,(int *)&server_public_key,
                               (uchar *)local_98,(int *)&server_host_key,0,
                               &(session->remote).crypt_abstract);
      if (iVar7 != 0) goto LAB_001136de;
      if ((int)server_public_key != 0) {
        explicit_bzero(ppvVar15,(long)((session->remote).crypt)->iv_len);
        (*session->free)(ppvVar15,&session->abstract);
      }
      ppvVar15 = local_98;
      if ((int)server_host_key != 0) {
        explicit_bzero(local_98,(long)((session->remote).crypt)->secret_len);
        (*session->free)(ppvVar15,&session->abstract);
      }
      goto LAB_0011373c;
    }
    iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
    if (((iVar7 == 0) ||
        (iVar7 = _libssh2_sha256_update
                           ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                            (key_state->exchange_state).k_value_len), iVar7 == 0)) ||
       (iVar7 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar14,0x20), iVar7 == 0)) break;
  }
LAB_00113694:
  (*session->free)(local_98,&session->abstract);
LAB_001136a3:
  (*session->free)(ppvVar15,&session->abstract);
LAB_001136aa:
  iVar7 = -5;
switchD_00112aa0_caseD_1:
  BN_clear_free((BIGNUM *)(key_state->exchange_state).k);
  (key_state->exchange_state).k = (BIGNUM *)0x0;
  puVar14 = (key_state->exchange_state).k_value;
  if (puVar14 != (uchar *)0x0) {
    (*session->free)(puVar14,&session->abstract);
    (key_state->exchange_state).k_value = (uchar *)0x0;
  }
  (key_state->exchange_state).state = libssh2_NB_state_idle;
LAB_001132b7:
  if (iVar7 == -0x25) {
    iVar7 = -0x25;
  }
  else {
    (*session->free)(key_state->data,&session->abstract);
switchD_00112910_caseD_1:
    if (key_state->curve25519_public_key != (uchar *)0x0) {
      explicit_bzero(key_state->curve25519_public_key,0x20);
      (*session->free)(key_state->curve25519_public_key,&session->abstract);
      key_state->curve25519_public_key = (uchar *)0x0;
    }
    if (key_state->curve25519_private_key != (uchar *)0x0) {
      explicit_bzero(key_state->curve25519_private_key,0x20);
      (*session->free)(key_state->curve25519_private_key,&session->abstract);
      key_state->curve25519_private_key = (uchar *)0x0;
    }
    key_state->state = libssh2_NB_state_idle;
  }
  return iVar7;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

clean_exit:

    if(key_state->curve25519_public_key) {
        _libssh2_explicit_zero(key_state->curve25519_public_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_public_key);
        key_state->curve25519_public_key = NULL;
    }

    if(key_state->curve25519_private_key) {
        _libssh2_explicit_zero(key_state->curve25519_private_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_private_key);
        key_state->curve25519_private_key = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    return ret;
}